

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_symbol_codec.cpp
# Opt level: O3

bool __thiscall
crnlib::symbol_codec::decode_receive_static_huffman_data_model
          (symbol_codec *this,static_huffman_data_model *model,
          static_huffman_data_model *pDeltaModel)

{
  vector<unsigned_char> *this_00;
  uchar uVar1;
  bool bVar2;
  bool bVar3;
  uint min_new_capacity;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  static_huffman_data_model dm;
  static_huffman_data_model local_70;
  static_huffman_data_model *local_38;
  
  min_new_capacity = get_bits(this,0xe);
  if (min_new_capacity == 0) {
    static_huffman_data_model::clear(model);
    bVar3 = true;
  }
  else {
    this_00 = &model->m_code_sizes;
    uVar4 = (model->m_code_sizes).m_size;
    if (uVar4 != min_new_capacity) {
      if (uVar4 <= min_new_capacity) {
        if ((model->m_code_sizes).m_capacity < min_new_capacity) {
          elemental_vector::increase_capacity
                    ((elemental_vector *)this_00,min_new_capacity,uVar4 + 1 == min_new_capacity,1,
                     (object_mover)0x0,false);
          uVar4 = (model->m_code_sizes).m_size;
        }
        memset(this_00->m_p + uVar4,0,(ulong)(min_new_capacity - uVar4));
      }
      (model->m_code_sizes).m_size = min_new_capacity;
    }
    bVar3 = false;
    local_38 = pDeltaModel;
    memset(this_00->m_p,0,(ulong)min_new_capacity);
    uVar5 = get_bits(this,5);
    if (0xffffffea < uVar5 - 0x16) {
      static_huffman_data_model::static_huffman_data_model(&local_70);
      if (local_70.m_code_sizes.m_size != 0x15) {
        if (local_70.m_code_sizes.m_size < 0x16) {
          if (local_70.m_code_sizes.m_capacity < 0x15) {
            elemental_vector::increase_capacity
                      ((elemental_vector *)&local_70.m_code_sizes,0x15,
                       local_70.m_code_sizes.m_size == 0x14,1,(object_mover)0x0,false);
          }
          memset(local_70.m_code_sizes.m_p + local_70.m_code_sizes.m_size,0,
                 (ulong)(0x15 - local_70.m_code_sizes.m_size));
        }
        local_70.m_code_sizes.m_size = 0x15;
      }
      uVar9 = 0;
      do {
        uVar6 = get_bits(this,3);
        local_70.m_code_sizes.m_p[(byte)(&g_most_probable_codelength_codes)[uVar9]] = (uchar)uVar6;
        uVar9 = uVar9 + 1;
      } while (uVar5 != uVar9);
      bVar2 = static_huffman_data_model::prepare_decoder_tables(&local_70);
      uVar9 = 0;
      bVar3 = false;
      if (bVar2) {
        do {
          uVar5 = decode(this,&local_70);
          uVar4 = (uint)uVar9;
          if (uVar5 < 0x11) {
            this_00->m_p[uVar9] = (uchar)uVar5;
            uVar9 = (ulong)(uVar4 + 1);
          }
          else {
            uVar8 = min_new_capacity - uVar4;
            if (uVar5 == 0x12) {
              uVar5 = get_bits(this,7);
              if (uVar8 < uVar5 + 0xb) goto LAB_001a3780;
              uVar9 = (ulong)(uVar4 + uVar5 + 0xb);
            }
            else if (uVar5 == 0x11) {
              uVar5 = get_bits(this,3);
              if (uVar8 < uVar5 + 3) goto LAB_001a3780;
              uVar9 = (ulong)(uVar4 + uVar5 + 3);
            }
            else {
              if (1 < uVar5 - 0x13) goto LAB_001a3780;
              if (uVar5 == 0x13) {
                uVar5 = get_bits(this,2);
                uVar7 = uVar5 + 3;
              }
              else {
                uVar5 = get_bits(this,6);
                uVar7 = uVar5 + 7;
              }
              bVar3 = false;
              if ((uVar4 == 0) || (uVar8 < uVar7)) goto LAB_001a3783;
              uVar1 = this_00->m_p[uVar4 - 1];
              if (uVar1 == '\0') goto LAB_001a3780;
              uVar7 = uVar7 + uVar4;
              if (uVar4 < uVar7) {
                do {
                  this_00->m_p[uVar9] = uVar1;
                  uVar9 = uVar9 + 1;
                } while (uVar7 != uVar9);
                uVar9 = (ulong)uVar7;
              }
            }
          }
        } while ((uint)uVar9 < min_new_capacity);
        if ((uint)uVar9 == min_new_capacity) {
          if (((local_38 != (static_huffman_data_model *)0x0) && (local_38->m_total_syms != 0)) &&
             (uVar4 = (local_38->m_code_sizes).m_size, uVar4 != 0)) {
            if (uVar4 < min_new_capacity) {
              min_new_capacity = uVar4;
            }
            uVar9 = 0;
            do {
              uVar8 = (uint)(local_38->m_code_sizes).m_p[uVar9] + (uint)this_00->m_p[uVar9];
              uVar4 = uVar8 - 0x11 & 0xff;
              if (uVar8 < 0x11) {
                uVar4 = uVar8;
              }
              this_00->m_p[uVar9] = (uchar)uVar4;
              uVar9 = uVar9 + 1;
            } while (min_new_capacity + (min_new_capacity == 0) != uVar9);
          }
          bVar3 = static_huffman_data_model::prepare_decoder_tables(model);
        }
        else {
LAB_001a3780:
          bVar3 = false;
        }
      }
LAB_001a3783:
      static_huffman_data_model::~static_huffman_data_model(&local_70);
    }
  }
  return bVar3;
}

Assistant:

bool symbol_codec::decode_receive_static_huffman_data_model(static_huffman_data_model& model, static_huffman_data_model* pDeltaModel) {
  CRNLIB_ASSERT(m_mode == cDecoding);

  const uint total_used_syms = decode_bits(math::total_bits(prefix_coding::cMaxSupportedSyms));
  if (!total_used_syms) {
    model.clear();
    return true;
  }

  model.m_code_sizes.resize(total_used_syms);
  memset(&model.m_code_sizes[0], 0, sizeof(model.m_code_sizes[0]) * total_used_syms);

  const uint num_codelength_codes_to_send = decode_bits(5);
  if ((num_codelength_codes_to_send < 1) || (num_codelength_codes_to_send > cMaxCodelengthCodes))
    return false;

  static_huffman_data_model dm;
  dm.m_code_sizes.resize(cMaxCodelengthCodes);

  for (uint i = 0; i < num_codelength_codes_to_send; i++)
    dm.m_code_sizes[g_most_probable_codelength_codes[i]] = static_cast<uint8>(decode_bits(3));

  if (!dm.prepare_decoder_tables())
    return false;

  uint ofs = 0;
  while (ofs < total_used_syms) {
    const uint num_remaining = total_used_syms - ofs;

    uint code = decode(dm);
    if (code <= 16)
      model.m_code_sizes[ofs++] = static_cast<uint8>(code);
    else if (code == cSmallZeroRunCode) {
      uint len = decode_bits(cSmallZeroRunExtraBits) + cMinSmallZeroRunSize;
      if (len > num_remaining)
        return false;
      ofs += len;
    } else if (code == cLargeZeroRunCode) {
      uint len = decode_bits(cLargeZeroRunExtraBits) + cMinLargeZeroRunSize;
      if (len > num_remaining)
        return false;
      ofs += len;
    } else if ((code == cSmallRepeatCode) || (code == cLargeRepeatCode)) {
      uint len;
      if (code == cSmallRepeatCode)
        len = decode_bits(cSmallNonZeroRunExtraBits) + cSmallMinNonZeroRunSize;
      else
        len = decode_bits(cLargeNonZeroRunExtraBits) + cLargeMinNonZeroRunSize;

      if ((!ofs) || (len > num_remaining))
        return false;
      const uint prev = model.m_code_sizes[ofs - 1];
      if (!prev)
        return false;
      const uint end = ofs + len;
      while (ofs < end)
        model.m_code_sizes[ofs++] = static_cast<uint8>(prev);
    } else {
      CRNLIB_ASSERT(0);
      return false;
    }
  }

  if (ofs != total_used_syms)
    return false;

  if ((pDeltaModel) && (pDeltaModel->get_total_syms())) {
    uint n = math::minimum(pDeltaModel->m_code_sizes.size(), total_used_syms);
    for (uint i = 0; i < n; i++) {
      int codesize = model.m_code_sizes[i] + pDeltaModel->m_code_sizes[i];
      if (codesize > 16)
        codesize -= 17;
      model.m_code_sizes[i] = static_cast<uint8>(codesize);
    }
  }

  return model.prepare_decoder_tables();
}